

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  code *pcVar5;
  uint16_t *in_RDX;
  uint16_t *in_RSI;
  uint16_t negone [16];
  uint16_t sqr [16];
  int jac;
  int nonzero;
  int vartime;
  int i;
  secp256k1_modinv32_modinfo m;
  secp256k1_modinv32_signed30 x;
  uint16_t tmp [16];
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  short in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff2a;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffff30;
  int local_8c;
  int local_88;
  int local_84 [5];
  secp256k1_modinv32_modinfo *in_stack_ffffffffffffff90;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffff98;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  ushort local_38 [8];
  uint16_t *in_stack_ffffffffffffffd8;
  uint16_t *in_stack_ffffffffffffffe0;
  
  uint16_to_signed30(in_stack_ffffffffffffff30,
                     (uint16_t *)CONCAT62(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28));
  uVar1 = (ushort)((((((((local_5c != 0 || local_58 != 0) || local_54 != 0) || local_50 != 0) ||
                      local_4c != 0) || local_48 != 0) || local_44 != 0) || local_40 != 0) ||
                  local_3c != 0);
  uint16_to_signed30(in_stack_ffffffffffffff30,
                     (uint16_t *)CONCAT62(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28));
  uVar4 = modinv2p64(CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  if ((((uint)uVar4 & 0x3fffffff) * local_84[0] & 0x3fffffff) != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x370,"test condition failed: ((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1");
    abort();
  }
  if (uVar1 != 0) {
    mulmod256(in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    uint16_to_signed30(in_stack_ffffffffffffff30,
                       (uint16_t *)CONCAT62(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28));
    uVar2 = secp256k1_jacobi32_maybe_var(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff27 = uVar2 < 2;
    if (!(bool)in_stack_ffffffffffffff27) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x37a,"test condition failed: jac == 0 || jac == 1");
      abort();
    }
    in_stack_ffffffffffffff28 = *in_RDX - 1;
    for (local_88 = 1; local_88 < 0x10; local_88 = local_88 + 1) {
      *(uint16_t *)(&stack0xffffffffffffff28 + (long)local_88 * 2) = in_RDX[local_88];
    }
    mulmod256(in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    uint16_to_signed30(in_stack_ffffffffffffff30,
                       (uint16_t *)CONCAT62(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28));
    iVar3 = secp256k1_jacobi32_maybe_var(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff26 = true;
    if (iVar3 != 0) {
      in_stack_ffffffffffffff26 = iVar3 == 1 - (*in_RDX & 2);
    }
    if (((in_stack_ffffffffffffff26 ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x382,"test condition failed: jac == 0 || jac == 1 - (mod[0] & 2)");
      abort();
    }
  }
  uint16_to_signed30(in_stack_ffffffffffffff30,
                     (uint16_t *)CONCAT62(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28));
  mutate_sign_signed30
            ((secp256k1_modinv32_signed30 *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  local_8c = 0;
  while( true ) {
    if (1 < local_8c) {
      return;
    }
    pcVar5 = secp256k1_modinv32;
    if (local_8c != 0) {
      pcVar5 = secp256k1_modinv32_var;
    }
    (*pcVar5)(&local_5c,local_84);
    signed30_to_uint16((uint16_t *)in_stack_ffffffffffffff30,
                       (secp256k1_modinv32_signed30 *)
                       CONCAT62(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28));
    mulmod256(in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (local_38[0] != uVar1) break;
    for (local_88 = 1; local_88 < 0x10; local_88 = local_88 + 1) {
      if (local_38[local_88] != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x391,"test condition failed: tmp[i] == 0");
        abort();
      }
    }
    pcVar5 = secp256k1_modinv32;
    if (local_8c != 0) {
      pcVar5 = secp256k1_modinv32_var;
    }
    (*pcVar5)(&local_5c,local_84);
    signed30_to_uint16((uint16_t *)in_stack_ffffffffffffff30,
                       (secp256k1_modinv32_signed30 *)
                       CONCAT62(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28));
    for (local_88 = 0; local_88 < 0x10; local_88 = local_88 + 1) {
      if (local_38[local_88] != in_RSI[local_88]) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x398,"test condition failed: tmp[i] == in[i]");
        abort();
      }
    }
    local_8c = local_8c + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x390,"test condition failed: tmp[0] == nonzero");
  abort();
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}